

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int scan_hexadecimal_number
              (OnigUChar **src,OnigUChar *end,int minlen,int maxlen,OnigEncoding enc,
              OnigCodePoint *rcode)

{
  OnigCodePoint OVar1;
  int iVar2;
  int iVar3;
  int local_64;
  int local_60;
  OnigUChar *pfetch_prev;
  OnigUChar *p;
  int n;
  uint val;
  OnigCodePoint c;
  OnigCodePoint code;
  OnigCodePoint *rcode_local;
  OnigEncoding enc_local;
  int maxlen_local;
  int minlen_local;
  OnigUChar *end_local;
  OnigUChar **src_local;
  
  val = 0;
  p._0_4_ = 0;
  pfetch_prev = *src;
  while (pfetch_prev < end && (int)p < maxlen) {
    OVar1 = (*enc->mbc_to_code)(pfetch_prev,end);
    iVar2 = (*enc->mbc_enc_len)(pfetch_prev);
    if ((0x7f < OVar1) || (iVar3 = (*enc->is_code_ctype)(OVar1,0xb), iVar3 == 0)) break;
    p._0_4_ = (int)p + 1;
    if ((OVar1 < 0x80) && (iVar3 = (*enc->is_code_ctype)(OVar1,4), iVar3 != 0)) {
      local_60 = OVar1 - 0x30;
    }
    else {
      iVar3 = (*enc->is_code_ctype)(OVar1,10);
      if (iVar3 == 0) {
        local_64 = OVar1 - 0x57;
      }
      else {
        local_64 = OVar1 - 0x37;
      }
      local_60 = local_64;
    }
    if (-local_60 - 1U >> 4 < val) {
      return -200;
    }
    val = val * 0x10 + local_60;
    pfetch_prev = pfetch_prev + iVar2;
  }
  if ((int)p < minlen) {
    src_local._4_4_ = -400;
  }
  else {
    *rcode = val;
    *src = pfetch_prev;
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

static int
scan_hexadecimal_number(UChar** src, UChar* end, int minlen, int maxlen,
                        OnigEncoding enc, OnigCodePoint* rcode)
{
  OnigCodePoint code;
  OnigCodePoint c;
  unsigned int val;
  int n;
  UChar* p;
  PFETCH_READY;

  p = *src;
  code = 0;
  n = 0;
  while (! PEND && n < maxlen) {
    PFETCH(c);
    if (IS_CODE_XDIGIT_ASCII(enc, c)) {
      n++;
      val = (unsigned int )XDIGITVAL(enc, c);
      if ((UINT_MAX - val) / 16UL < code)
        return ONIGERR_TOO_BIG_NUMBER; /* overflow */

      code = (code << 4) + val;
    }
    else {
      PUNFETCH;
      break;
    }
  }

  if (n < minlen)
    return ONIGERR_INVALID_CODE_POINT_VALUE;

  *rcode = code;
  *src = p;
  return ONIG_NORMAL;
}